

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip39.c
# Opt level: O0

int bip39_get_word(words *w,size_t idx,char **output)

{
  char *pcVar1;
  words *local_38;
  char *word;
  char **output_local;
  size_t idx_local;
  words *w_local;
  
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  local_38 = w;
  if (w == (words *)0x0) {
    local_38 = &en_words;
  }
  if ((output == (char **)0x0) ||
     (pcVar1 = wordlist_lookup_index(local_38,idx), pcVar1 == (char *)0x0)) {
    w_local._4_4_ = -2;
  }
  else {
    pcVar1 = wally_strdup(pcVar1);
    *output = pcVar1;
    w_local._4_4_ = -3;
    if (*output != (char *)0x0) {
      w_local._4_4_ = 0;
    }
  }
  return w_local._4_4_;
}

Assistant:

int bip39_get_word(const struct words *w, size_t idx,
                   char **output)
{
    const char *word;

    if (output)
        *output = NULL;

    w = w ? w : &en_words;

    if (!output || !(word = wordlist_lookup_index(w, idx)))
        return WALLY_EINVAL;

    *output = wally_strdup(word);
    return *output ? WALLY_OK : WALLY_ENOMEM;
}